

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_unset_property(Integer g_a)

{
  long lVar1;
  short sVar2;
  int iVar3;
  global_array_t *pgVar4;
  bool bVar5;
  Integer IVar6;
  logical lVar7;
  C_Integer *pCVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Integer *__ptr;
  void *__ptr_00;
  cache_struct_t *pcVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  cache_struct *pcVar16;
  Integer status;
  Integer local_108;
  long local_100;
  Integer local_f8;
  void *ptr;
  Integer hi [7];
  Integer lo [7];
  Integer ld [7];
  
  lVar1 = g_a + 1000;
  pgVar4 = GA + lVar1;
  if (GA[lVar1].property == 2) {
    pcVar12 = pgVar4->cache_head;
    if (pcVar12 == (cache_struct_t *)0x0) {
LAB_00164605:
      GA[lVar1].cache_head = (cache_struct_t *)0x0;
      return;
    }
    __ptr_00 = pcVar12->cache_buf;
    pcVar16 = pcVar12->next;
    if (__ptr_00 != (void *)0x0) goto LAB_001645c3;
    do {
      pcVar12 = GA[lVar1].cache_head;
      do {
        free(pcVar12);
        if (pcVar16 == (cache_struct *)0x0) goto LAB_00164605;
        GA[lVar1].cache_head = pcVar16;
        pcVar16 = pcVar16->next;
        pcVar12 = GA[lVar1].cache_head;
        __ptr_00 = pcVar12->cache_buf;
      } while (__ptr_00 == (void *)0x0);
LAB_001645c3:
      free(__ptr_00);
    } while( true );
  }
  if (GA[lVar1].property != 1) {
    pgVar4->property = 0;
    return;
  }
  sVar2 = pgVar4->ndim;
  lVar14 = (long)sVar2;
  IVar6 = pnga_create_handle();
  pnga_set_data(IVar6,lVar14,GA[lVar1].dims,(long)GA[lVar1].type);
  pnga_set_pgroup(IVar6,(long)GA[lVar1].old_handle);
  lVar7 = pnga_allocate(IVar6);
  if (lVar7 == 0) {
    pnga_error("Failed to allocate temporary array",0);
  }
  local_108 = GAme;
  if (-1 < (long)GA[lVar1].old_handle) {
    local_108 = (long)PGRP_LIST[GA[lVar1].old_handle].map_proc_list[GAme];
  }
  local_f8 = IVar6;
  pnga_distribution(IVar6,local_108,lo,hi);
  uVar15 = (ulong)(uint)(int)sVar2;
  local_100 = lVar14;
  if (sVar2 < 1) {
LAB_00164194:
    pnga_access_ptr(local_f8,lo,hi,&ptr,ld);
    lVar14 = local_100;
    pnga_get(g_a,lo,hi,ptr,ld);
  }
  else {
    bVar5 = true;
    uVar9 = 0;
    do {
      ld[uVar9] = (hi[uVar9] - lo[uVar9]) + 1;
      if (hi[uVar9] < lo[uVar9]) {
        bVar5 = false;
      }
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
    if (bVar5) goto LAB_00164194;
  }
  lVar10 = (long)GA[lVar1].p_handle;
  if (lVar10 < 1) {
    lVar11 = GAme;
    if (-1 < GA[lVar1].p_handle) {
      lVar11 = (long)*(int *)(*(long *)((long)&PGRP_LIST->map_proc_list + (lVar10 * 5 << 0x23)) +
                             GAme * 4);
    }
    ARMCI_Free(GA[lVar1].ptr[lVar11] + -GA[lVar1].id);
  }
  else {
    ARMCI_Free_group(GA[lVar1].ptr[PGRP_LIST[lVar10].map_proc_list[GAme]] + -GA[lVar1].id,
                     &PGRP_LIST[lVar10].group);
  }
  pgVar4 = GA;
  if ((short)lVar14 < 1) {
    iVar13 = 0;
  }
  else {
    uVar9 = 0;
    iVar13 = 0;
    do {
      iVar3 = pgVar4[g_a + 1000].old_nblock[uVar9];
      pgVar4[g_a + 1000].nblock[uVar9] = iVar3;
      pgVar4[g_a + 1000].lo[uVar9] = (long)pgVar4[g_a + 1000].old_lo[uVar9];
      pgVar4[g_a + 1000].chunk[uVar9] = (long)pgVar4[g_a + 1000].old_chunk[uVar9];
      iVar13 = iVar13 + iVar3;
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
  }
  free(pgVar4[lVar1].mapc);
  pCVar8 = (C_Integer *)malloc((long)(int)(iVar13 + 1U) << 3);
  GA[lVar1].mapc = pCVar8;
  if (iVar13 < 0) {
    __ptr = GA[lVar1].old_mapc;
  }
  else {
    pCVar8 = GA[lVar1].mapc;
    __ptr = GA[lVar1].old_mapc;
    uVar9 = 0;
    do {
      pCVar8[uVar9] = __ptr[uVar9];
      uVar9 = uVar9 + 1;
    } while (iVar13 + 1U != uVar9);
  }
  free(__ptr);
  pnga_distribution(g_a,local_108,GA[lVar1].lo,hi);
  pgVar4 = GA;
  if ((short)lVar14 < 1) {
    lVar14 = (long)GA[lVar1].elemsize;
  }
  else {
    bVar5 = true;
    lVar10 = 1;
    uVar9 = 0;
    do {
      if (hi[uVar9] < GA[g_a + 1000].lo[uVar9]) {
        bVar5 = false;
      }
      lVar10 = lVar10 * ((hi[uVar9] - GA[g_a + 1000].lo[uVar9]) + 1);
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
    lVar14 = 0;
    if (bVar5) {
      lVar14 = lVar10 * GA[lVar1].elemsize;
    }
  }
  lVar10 = GA[lVar1].size;
  if (GA_memory_limited == '\0') {
    GAstat.curmem = GAstat.curmem - lVar10;
    status = 1;
    IVar6 = (Integer)GA[lVar1].p_handle;
    iVar13 = GA[lVar1].old_handle;
    GA[lVar1].p_handle = iVar13;
LAB_00164482:
    if (pgVar4[lVar1].mem_dev_set == 0) {
      iVar13 = gai_get_shmem(pgVar4[lVar1].ptr,lVar14,pgVar4[lVar1].type,&pgVar4[lVar1].id,iVar13);
    }
    else {
      iVar13 = gai_get_devmem(pgVar4[lVar1].mem_dev,pgVar4[lVar1].ptr,lVar14,pgVar4[lVar1].type,
                              &pgVar4[lVar1].id,iVar13,pgVar4[lVar1].mem_dev_set,
                              pgVar4[lVar1].mem_dev);
    }
    status = (Integer)(iVar13 == 0);
  }
  else {
    GAstat.curmem = GAstat.curmem - lVar10;
    GA_total_memory = (GA_total_memory + lVar10) - lVar14;
    status = (ulong)~GA_total_memory >> 0x3f;
    iVar13 = GA[lVar1].old_handle;
    IVar6 = pnga_type_f2c(0x3f2);
    pnga_pgroup_gop((long)iVar13,IVar6,&status,1,"&&");
    pgVar4 = GA;
    IVar6 = (Integer)GA[lVar1].p_handle;
    iVar13 = GA[lVar1].old_handle;
    GA[lVar1].p_handle = iVar13;
    if (status != 0) goto LAB_00164482;
    pgVar4[lVar1].ptr[local_108] = (char *)0x0;
  }
  GA[lVar1].size = lVar14;
  if (status == 0) {
    pnga_error("Memory failure when setting READ_ONLY",0);
  }
  pnga_pgroup_destroy(IVar6);
  GA[lVar1].property = 0;
  pnga_distribution(g_a,GAme,lo,hi);
  IVar6 = local_f8;
  if (0 < (short)local_100) {
    bVar5 = true;
    uVar9 = 0;
    do {
      ld[uVar9] = (hi[uVar9] - lo[uVar9]) + 1;
      if (hi[uVar9] < lo[uVar9]) {
        bVar5 = false;
      }
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
    if (!bVar5) goto LAB_0016459b;
  }
  pnga_access_ptr(g_a,lo,hi,&ptr,ld);
  pnga_get(IVar6,lo,hi,ptr,ld);
LAB_0016459b:
  pnga_destroy(IVar6);
  return;
}

Assistant:

void pnga_unset_property(Integer g_a) {
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].property == READ_ONLY) {
    /* TODO: Copy global array to original configuration */
    int i, d, ndim, btot, chk;
    Integer g_tmp, grp_me;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status;
    Integer *list;
    Integer dims[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    void *ptr, *buf;

    ndim = (int)GA[ga_handle].ndim;
    /* Start by making a copy of the GA */
    for (i=0; i<ndim; i++) {
      chunk[i] = GA[ga_handle].chunk[i];
      dims[i] = GA[ga_handle].dims[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].old_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    /* Copy portion of global array to locally held portion of tmp array */
    grp_me = pnga_pgroup_nodeid(GA[ga_handle].old_handle);
    pnga_distribution(g_tmp,grp_me,lo,hi);
    chk = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr(g_tmp,lo,hi,&ptr,ld);
      pnga_get(g_a,lo,hi,ptr,ld);
    }

    /* Get rid of current memory allocation */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)GA[ga_handle].p_handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].p_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].p_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif
    
    /* Reset distribution parameters back to original values */
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].nblock[i] = GA[ga_handle].old_nblock[i];
      GA[ga_handle].lo[i] = GA[ga_handle].old_lo[i];
      GA[ga_handle].chunk[i] = GA[ga_handle].old_chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].mapc[i] = GA[ga_handle].old_mapc[i];
    }
    free(GA[ga_handle].old_mapc);

    pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(GA[ga_handle].old_handle,pnga_type_f2c(MT_F_INT),
          &status, 1, "&&");
    } else status = 1;
    handle = (Integer)GA[ga_handle].p_handle;
    GA[ga_handle].p_handle = GA[ga_handle].old_handle;
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when setting READ_ONLY",0);
    }
    /* Get rid of read-only group */
    pnga_pgroup_destroy(handle);
    /* Generate parameters for new memory allocation. Distribution function
     * should work, so we can use that to find out how much data is on this
     * processor */
    GA[ga_handle].property = NO_PROPERTY;
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      pnga_get(g_tmp,lo,hi,ptr,ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (void*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      memcpy(ptr,buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (GA[ga_handle].property == READ_CACHE) {
    if (GA[ga_handle].cache_head != NULL) {
      cache_struct_t *next;
      next = GA[ga_handle].cache_head->next;
      if (GA[ga_handle].cache_head->cache_buf)
        free(GA[ga_handle].cache_head->cache_buf);
      free(GA[ga_handle].cache_head);
      while (next) {
        GA[ga_handle].cache_head = next;
        next = next->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
      }
    }
    GA[ga_handle].cache_head = NULL;
  } else {
    GA[ga_handle].property = NO_PROPERTY;
  }
}